

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_array_stride
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  uint32_t uVar1;
  uint32_t uVar2;
  SPIRType *type_00;
  
  uVar1 = (type->parent_type).id;
  if (uVar1 != 0) {
    type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar1);
    uVar1 = type_to_packed_size(this,type_00,flags,packing);
    uVar2 = type_to_packed_alignment(this,type,flags,packing);
    return -uVar2 & (uVar2 + uVar1) - 1;
  }
  __assert_fail("parent",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0x663,
                "uint32_t spirv_cross::CompilerGLSL::type_to_packed_array_stride(const SPIRType &, const Bitset &, BufferPackingStandard)"
               );
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_array_stride(const SPIRType &type, const Bitset &flags,
                                                   BufferPackingStandard packing)
{
	// Array stride is equal to aligned size of the underlying type.
	uint32_t parent = type.parent_type;
	assert(parent);

	auto &tmp = get<SPIRType>(parent);

	uint32_t size = type_to_packed_size(tmp, flags, packing);
	uint32_t alignment = type_to_packed_alignment(type, flags, packing);
	return (size + alignment - 1) & ~(alignment - 1);
}